

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

Bool inRemovedInfo(uint tid)

{
  uint *puVar1;
  long lVar2;
  
  lVar2 = 8;
  do {
    if (lVar2 + 0x10 == 0xd8) {
      return no;
    }
    puVar1 = (uint *)((long)&html5Info[0].tag + lVar2);
    lVar2 = lVar2 + 0x10;
  } while (*puVar1 != tid);
  return yes;
}

Assistant:

Bool inRemovedInfo( uint tid )
{
    int i;
    for (i = 0; ; i++) {
        if (html5Info[i].tag == 0)
            break;
        if (html5Info[i].id == tid)
            return yes;
    }
    return no;
}